

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
wasm::Builder::makeTable(Name name,Type type,Address initial,Address max)

{
  undefined8 *puVar1;
  undefined8 in_R9;
  
  puVar1 = (undefined8 *)operator_new(0x50);
  puVar1[8] = 0;
  puVar1[9] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0xffffffff;
  wasm::Type::Type((Type *)(puVar1 + 9),(HeapType)0x1,Nullable);
  *(undefined8 **)name.super_IString.str._M_len = puVar1;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = type.id;
  puVar1[9] = initial.addr;
  puVar1[7] = max.addr;
  puVar1[8] = in_R9;
  return (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
         (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)name.super_IString.str._M_len;
}

Assistant:

static std::unique_ptr<Table> makeTable(Name name,
                                          Type type = Type(HeapType::func,
                                                           Nullable),
                                          Address initial = 0,
                                          Address max = Table::kMaxSize) {
    auto table = std::make_unique<Table>();
    table->name = name;
    table->type = type;
    table->initial = initial;
    table->max = max;
    return table;
  }